

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

size_t elf_addrela(GlobalVars *gv,LinkedSection *ls,Reloc *rel,bool be,RelocList *reloclist,
                  _func_uint8_t_Reloc_ptr *reloc_vlink2elf)

{
  long lVar1;
  char cVar2;
  uint32_t uVar3;
  undefined4 in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint8_t *in_R8;
  Reloc *in_R9;
  RelocInsert *ri;
  uint8_t rtype;
  uint32_t symidx;
  undefined8 in_stack_ffffffffffffff90;
  bool be_00;
  char *in_stack_ffffffffffffff98;
  SymTabList *in_stack_ffffffffffffffa0;
  uint64_t in_stack_ffffffffffffffa8;
  RelocList *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffd8;
  size_t local_8;
  
  be_00 = (bool)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  if ((*(byte *)(in_RDX + 0x39) & 0x10) == 0) {
    if (*(long *)(in_RDX + 0x10) == 0) {
      if (*(long *)(in_RDX + 0x18) == 0) {
        if ((*(byte *)(in_RDX + 0x39) & 0xc0) == 0) {
          return 0;
        }
        ierror("elf_addrela(): Reloc type %d (%s) at %s+0x%lx (addend 0x%llx) is missing a relocsect.lnk"
               ,(ulong)*(byte *)(in_RDX + 0x38),reloc_name[*(byte *)(in_RDX + 0x38)],
               *(undefined8 *)(in_RSI + 0x18),*(undefined8 *)(in_RDX + 0x20),
               *(undefined8 *)(in_RDX + 0x28));
      }
      uVar3 = *(int *)(*(long *)(in_RDX + 0x18) + 0x10) + secsyms;
    }
    else {
      uVar3 = elf_extsymidx(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    cVar2 = (*(code *)in_R9)(in_RDX);
    uVar4 = CONCAT13(cVar2,(int3)in_stack_ffffffffffffffc0);
    if (cVar2 == '\0') {
      lVar1 = *(long *)(in_RDX + 0x30);
      if (lVar1 == 0) {
        ierror("elf_addrela(): Reloc without insert-field");
      }
      else {
        be_00 = (bool)((ulong)*(undefined8 *)(in_RDX + 0x20) >> 0x20);
        error(0x20,fff[*(byte *)(in_RDI + 0x58)]->tname,reloc_name[*(byte *)(in_RDX + 0x38)],
              (ulong)*(ushort *)(lVar1 + 8),(ulong)*(ushort *)(lVar1 + 10),
              *(undefined8 *)(lVar1 + 0x10),*(undefined8 *)(in_RSI + 0x18));
      }
    }
    elf_addrelocnode(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                     (uint64_t)in_stack_ffffffffffffffa0,
                     (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                     (uint32_t)in_stack_ffffffffffffff98,be_00);
    writesection((GlobalVars *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8,in_R9,
                 CONCAT44(uVar3,uVar4));
    local_8 = *(size_t *)(in_R8 + 0x20);
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t elf_addrela(struct GlobalVars *gv,struct LinkedSection *ls,
                   struct Reloc *rel,bool be,struct RelocList *reloclist,
                   uint8_t (*reloc_vlink2elf)(struct Reloc *))
{
  uint32_t symidx;
  uint8_t rtype;

  if (rel->flags & RELF_INTERNAL)
    return 0;  /* internal relocations will never be exported */

  if (rel->xrefname) {
    symidx = elf_extsymidx(&elfsymlist,rel->xrefname);
  }
  else {
    if (rel->relocsect.lnk == NULL) {
      if (!(rel->flags & RELF_DYNLINK))
        return 0;  /* ignore, because it was resolved by a shared object */
      else
        ierror("elf_addrela(): Reloc type %d (%s) at %s+0x%lx (addend 0x%llx)"
               " is missing a relocsect.lnk",(int)rel->rtype,
               reloc_name[rel->rtype],ls->name,rel->offset,rel->addend);
    }
    symidx = (uint32_t)(rel->relocsect.lnk->index + secsyms);
  }

  if (!(rtype = reloc_vlink2elf(rel))) {
    struct RelocInsert *ri;

    if (ri = rel->insert)
      error(32,fff[gv->dest_format]->tname,reloc_name[rel->rtype],
            (int)ri->bpos,(int)ri->bsiz,ri->mask,ls->name,rel->offset);
    else
      ierror("elf_addrela(): Reloc without insert-field");
  }

  elf_addrelocnode(reloclist,ls->base+rel->offset,rel->addend,symidx,rtype,be);
  writesection(gv,ls->data+rel->offset,rel,
               gv->reloctab_format==RTAB_ADDEND ? 0 : rel->addend);
  return reloclist->writesize;
}